

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglframebufferobject.cpp
# Opt level: O2

bool __thiscall QOpenGLFramebufferObject::isBound(QOpenGLFramebufferObject *this)

{
  QOpenGLFramebufferObjectPrivate *pQVar1;
  QOpenGLSharedResourceGuard *pQVar2;
  long lVar3;
  long *plVar4;
  uint uVar5;
  long in_FS_OFFSET;
  GLint fbo;
  uint local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d;
  lVar3 = QOpenGLContext::currentContext();
  uVar5 = 0;
  if (lVar3 != 0) {
    local_24 = 0;
    plVar4 = (long *)QOpenGLContext::functions();
    (**(code **)(*plVar4 + 200))(0x8ca6,&local_24);
    pQVar2 = pQVar1->fbo_guard;
    if (pQVar2 != (QOpenGLSharedResourceGuard *)0x0) {
      uVar5 = *(uint *)(pQVar2 + 0x10);
    }
    uVar5 = (uint)(local_24 == uVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return SUB41(uVar5,0);
  }
  __stack_chk_fail();
}

Assistant:

bool QOpenGLFramebufferObject::isBound() const
{
    Q_D(const QOpenGLFramebufferObject);
    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    if (!ctx)
        return false;
    GLint fbo = 0;
    ctx->functions()->glGetIntegerv(GL_FRAMEBUFFER_BINDING, &fbo);
    return GLuint(fbo) == d->fbo();
}